

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O1

bool __thiscall QWidgetWindow::updateSize(QWidgetWindow *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  
  bVar7 = QWidget::testAttribute_helper((QWidget *)(this->m_widget).wp.value,WA_OutsideWSRange);
  if ((!bVar7) &&
     (bVar7 = QWidget::testAttribute_helper
                        ((QWidget *)(this->m_widget).wp.value,WA_DontShowOnScreen), !bVar7)) {
    lVar5 = *(long *)((this->m_widget).wp.value + 0x20);
    iVar1 = *(int *)(lVar5 + 0x1c);
    iVar2 = *(int *)(lVar5 + 0x20);
    iVar3 = *(int *)(lVar5 + 0x14);
    iVar4 = *(int *)(lVar5 + 0x18);
    auVar8 = QWindow::geometry();
    bVar7 = (auVar8._12_4_ - auVar8._4_4_) + 1 != (iVar2 - iVar4) + 1;
    bVar6 = (auVar8._8_4_ - auVar8._0_4_) + 1 != (iVar1 - iVar3) + 1;
    if (bVar7 || bVar6) {
      lVar5 = *(long *)((this->m_widget).wp.value + 0x20);
      auVar8 = QWindow::geometry();
      *(int *)(lVar5 + 0x1c) = (auVar8._8_4_ - auVar8._0_4_) + *(int *)(lVar5 + 0x14);
      *(int *)(lVar5 + 0x20) = (auVar8._12_4_ - auVar8._4_4_) + *(int *)(lVar5 + 0x18);
    }
    updateMargins(this);
    return bVar7 || bVar6;
  }
  return false;
}

Assistant:

bool QWidgetWindow::updateSize()
{
    bool changed = false;
    if (m_widget->testAttribute(Qt::WA_OutsideWSRange))
        return changed;
    if (m_widget->testAttribute(Qt::WA_DontShowOnScreen))
        return changed;

    if (m_widget->data->crect.size() != geometry().size()) {
        changed = true;
        m_widget->data->crect.setSize(geometry().size());
    }

    updateMargins();
    return changed;
}